

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

void __thiscall
chrono::ChSystemDescriptor::ConvertToMatrixForm
          (ChSystemDescriptor *this,ChSparseMatrix *Cq,ChSparseMatrix *H,ChSparseMatrix *E,
          ChVectorDynamic<> *Fvector,ChVectorDynamic<> *Bvector,ChVectorDynamic<> *Frict,
          bool only_bilaterals,bool skip_contacts_uv)

{
  Scalar SVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  ChVariables *pCVar7;
  ChKblock *pCVar8;
  int iVar9;
  long lVar10;
  pointer ppCVar11;
  Scalar *pSVar12;
  long lVar13;
  size_t ic;
  long lVar14;
  ulong uVar15;
  ChConstraint *pCVar16;
  long lVar17;
  size_t iv;
  int iVar18;
  size_t ic_1;
  ChVectorRef local_80;
  Type local_68;
  
  ppCVar2 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar3 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar4 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar18 = 0;
  ppCVar5 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar6 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar17 = (long)(this->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3;
  for (lVar14 = 0; lVar17 != lVar14; lVar14 = lVar14 + 1) {
    pCVar16 = ppCVar2[lVar14];
    if ((pCVar16->active == true) && (!only_bilaterals || pCVar16->mode != CONSTRAINT_FRIC)) {
      lVar10 = __dynamic_cast(pCVar16,&ChConstraint::typeinfo,
                              &ChConstraintTwoTuplesFrictionTall::typeinfo,0xfffffffffffffffe);
      iVar18 = iVar18 + (uint)(lVar10 == 0 || !skip_contacts_uv);
    }
  }
  iVar9 = (*this->_vptr_ChSystemDescriptor[7])(this);
  lVar14 = (long)iVar18;
  this->n_q = iVar9;
  if (Cq != (ChSparseMatrix *)0x0) {
    Eigen::SparseMatrix<double,_1,_int>::resize(Cq,lVar14,(long)iVar9);
  }
  if (H != (ChSparseMatrix *)0x0) {
    Eigen::SparseMatrix<double,_1,_int>::resize(H,(long)this->n_q,(long)this->n_q);
  }
  if (E != (ChSparseMatrix *)0x0) {
    Eigen::SparseMatrix<double,_1,_int>::resize(E,lVar14,lVar14);
  }
  if (Fvector != (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              (&Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)this->n_q);
  }
  if (Bvector != (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              (&Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar14);
  }
  if (Frict != (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              (&Frict->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar14);
  }
  uVar15 = 0;
  for (lVar14 = 0; (long)ppCVar3 - (long)ppCVar5 >> 3 != lVar14; lVar14 = lVar14 + 1) {
    ppCVar11 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    pCVar7 = ppCVar11[lVar14];
    if (pCVar7->disabled == false) {
      if (H != (ChSparseMatrix *)0x0) {
        (*pCVar7->_vptr_ChVariables[9])(this->c_a,pCVar7,H,uVar15,uVar15);
        ppCVar11 = (this->vvariables).
                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      }
      if (Fvector != (ChVectorDynamic<> *)0x0) {
        ChVariables::Get_fb(&local_80,ppCVar11[lVar14]);
        iVar18 = (*(this->vvariables).
                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar14]->_vptr_ChVariables[2])();
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
                  (&local_68,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)Fvector,
                   (long)(int)uVar15,iVar18);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                  (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
                   &local_80);
        ppCVar11 = (this->vvariables).
                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      }
      iVar18 = (*ppCVar11[lVar14]->_vptr_ChVariables[2])();
      uVar15 = (ulong)(uint)((int)uVar15 + iVar18);
    }
  }
  if (H != (ChSparseMatrix *)0x0) {
    for (lVar14 = 0; (long)ppCVar4 - (long)ppCVar6 >> 3 != lVar14; lVar14 = lVar14 + 1) {
      pCVar8 = (this->vstiffness).
               super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar14];
      (*pCVar8->_vptr_ChKblock[6])(pCVar8,H,1);
    }
  }
  uVar15 = 0;
  lVar14 = 0;
  do {
    if (lVar17 == lVar14) {
      return;
    }
    pCVar16 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar14];
    if ((pCVar16->active == true) && (!only_bilaterals || pCVar16->mode != CONSTRAINT_FRIC)) {
      lVar10 = __dynamic_cast(pCVar16,&ChConstraint::typeinfo,
                              &ChConstraintTwoTuplesFrictionTall::typeinfo,0xfffffffffffffffe);
      if (!skip_contacts_uv || lVar10 == 0) {
        if (Cq != (ChSparseMatrix *)0x0) {
          (*pCVar16->_vptr_ChConstraint[0xd])(pCVar16,Cq,uVar15);
        }
        if (E != (ChSparseMatrix *)0x0) {
          (**E->_vptr_SparseMatrix)
                    ((this->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar14]->cfm_i,E,uVar15,uVar15,1);
        }
        lVar10 = (long)(int)uVar15;
        if (Bvector != (ChVectorDynamic<> *)0x0) {
          SVar1 = (this->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar14]->b_i;
          pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Bvector
                               ,lVar10);
          *pSVar12 = SVar1;
        }
        if (Frict != (ChVectorDynamic<> *)0x0) {
          pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Frict,
                               lVar10);
          *pSVar12 = -2.0;
          pCVar16 = (this->vconstraints).
                    super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar14];
          if (pCVar16 != (ChConstraint *)0x0) {
            pSVar12 = (Scalar *)
                      __dynamic_cast(pCVar16,&ChConstraint::typeinfo,
                                     &ChConstraintTwoTuplesContactNall::typeinfo,0xfffffffffffffffe)
            ;
            if (pSVar12 != (Scalar *)0x0) {
              SVar1 = *pSVar12;
              pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                   Frict,lVar10);
              *pSVar12 = SVar1;
              pCVar16 = (this->vconstraints).
                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar14];
              if (pCVar16 == (ChConstraint *)0x0) goto LAB_00cf0399;
            }
            lVar13 = __dynamic_cast(pCVar16,&ChConstraint::typeinfo,
                                    &ChConstraintTwoTuplesFrictionTall::typeinfo,0xfffffffffffffffe)
            ;
            if (lVar13 != 0) {
              pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                   Frict,lVar10);
              *pSVar12 = (Scalar)&DAT_bff0000000000000;
            }
          }
        }
LAB_00cf0399:
        uVar15 = (ulong)((int)uVar15 + 1);
      }
    }
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

void ChSystemDescriptor::ConvertToMatrixForm(ChSparseMatrix* Cq,
                                             ChSparseMatrix* H,
                                             ChSparseMatrix* E,
                                             ChVectorDynamic<>* Fvector,
                                             ChVectorDynamic<>* Bvector,
                                             ChVectorDynamic<>* Frict,
                                             bool only_bilaterals,
                                             bool skip_contacts_uv) {
    std::vector<ChConstraint*>& mconstraints = GetConstraintsList();
    std::vector<ChVariables*>& mvariables = GetVariablesList();

    auto mv_size = mvariables.size();
    auto mc_size = mconstraints.size();
    auto vs_size = vstiffness.size();

    // Count bilateral and other constraints.. (if wanted, bilaterals only)

    int mn_c = 0;
    for (size_t ic = 0; ic < mc_size; ic++) {
        if (mconstraints[ic]->IsActive())
            if (!((mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) && only_bilaterals))
                if (!((dynamic_cast<ChConstraintTwoTuplesFrictionTall*>(mconstraints[ic])) && skip_contacts_uv)) {
                    mn_c++;
                }
    }

    // Count active variables, by scanning through all variable blocks,
    // and set offsets

    n_q = CountActiveVariables();

    // Reset and resize (if needed) auxiliary vectors

    if (Cq)
        Cq->resize(mn_c, n_q);
    if (H)
        H->resize(n_q, n_q);
    if (E)
        E->resize(mn_c, mn_c);
    if (Fvector)
        Fvector->setZero(n_q);
    if (Bvector)
        Bvector->setZero(mn_c);
    if (Frict)
        Frict->setZero(mn_c);

    // Fills H submasses and 'f' vector,
    // by looping on variables
    int s_q = 0;
    for (size_t iv = 0; iv < mv_size; iv++) {
        if (mvariables[iv]->IsActive()) {
            if (H)
                mvariables[iv]->Build_M(*H, s_q, s_q, c_a);  // .. fills  H  (often H=M , the mass)
            if (Fvector)
                Fvector->segment(s_q, vvariables[iv]->Get_ndof()) = vvariables[iv]->Get_fb();  // .. fills  'f'
            s_q += mvariables[iv]->Get_ndof();
        }
    }

    // If some stiffness / hessian matrix has been added to H ,
    // also add it to the sparse H
    if (H) {
        for (size_t ik = 0; ik < vs_size; ik++) {
            vstiffness[ik]->Build_K(*H, true);
        }
    }

    // Fills Cq jacobian, E 'compliance' matrix , the 'b' vector and friction coeff.vector,
    // by looping on constraints
    int s_c = 0;
    for (size_t ic = 0; ic < mc_size; ic++) {
        if (mconstraints[ic]->IsActive())
            if (!((mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) && only_bilaterals))
                if (!((dynamic_cast<ChConstraintTwoTuplesFrictionTall*>(mconstraints[ic])) && skip_contacts_uv)) {
                    if (Cq)
                        mconstraints[ic]->Build_Cq(*Cq, s_c);  // .. fills Cq
                    if (E)
                        E->SetElement(s_c, s_c, mconstraints[ic]->Get_cfm_i());  // .. fills E ( = cfm )
                    if (Bvector)
                        (*Bvector)(s_c) = mconstraints[ic]->Get_b_i();  // .. fills 'b'
                    if (Frict)                                          // .. fills vector of friction coefficients
                    {
                        (*Frict)(s_c) = -2;  // mark with -2 flag for bilaterals (default)
                        if (auto mcon = dynamic_cast<ChConstraintTwoTuplesContactNall*>(mconstraints[ic]))
                            (*Frict)(s_c) =
                                mcon->GetFrictionCoefficient();  // friction coeff only in row of normal component
                        if (dynamic_cast<ChConstraintTwoTuplesFrictionTall*>(mconstraints[ic]))
                            (*Frict)(s_c) = -1;  // mark with -1 flag for rows of tangential components
                    }
                    s_c++;
                }
    }
}